

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_minotaur.cpp
# Opt level: O1

int AF_A_MinotaurChase(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *self;
  undefined8 *puVar2;
  AActor *pAVar3;
  PClass *pPVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined8 uVar7;
  PClass *pPVar8;
  undefined4 extraout_var_00;
  VMValue *pVVar9;
  FState *newstate;
  char *__assertion;
  FString *this;
  long lVar10;
  bool bVar11;
  VMValue params [3];
  FSoundID local_78;
  FName local_74;
  DAngle local_70;
  anon_union_16_5_cf148060_for_VMValue_0 local_68;
  AActor *local_58;
  undefined4 local_50;
  undefined1 local_4c;
  FString local_48;
  undefined4 local_40;
  char local_3c [12];
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005c750c;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    self = *(AActor **)&param->field_0;
    pVVar9 = param;
    uVar6 = numparam;
    if (self != (AActor *)0x0) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar8 = (self->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar11;
      uVar6 = (uint)bVar11;
      pVVar9 = (VMValue *)(ulong)(pPVar8 == pPVar4 || bVar11);
      if (pPVar8 != pPVar4 && !bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar8 != (PClass *)0x0);
          if (pPVar8 == pPVar4) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_005c750c;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005c74e1;
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar2 != (undefined8 *)0x0) {
        if (puVar2[1] == 0) {
          uVar7 = (**(code **)*puVar2)(puVar2,pVVar9,uVar6,ret);
          puVar2[1] = uVar7;
        }
        pPVar8 = (PClass *)puVar2[1];
        bVar11 = pPVar8 != (PClass *)0x0;
        if (pPVar8 != pPVar4 && bVar11) {
          do {
            pPVar8 = pPVar8->ParentClass;
            bVar11 = pPVar8 != (PClass *)0x0;
            if (pPVar8 == pPVar4) break;
          } while (pPVar8 != (PClass *)0x0);
        }
        if (!bVar11) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005c750c;
        }
      }
    }
    pPVar4 = AMinotaurFriend::RegistrationInfo.MyClass;
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      if ((self->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
        (self->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar5);
      }
      pPVar8 = (self->super_DThinker).super_DObject.Class;
      bVar11 = pPVar8 != (PClass *)0x0;
      if (pPVar8 != pPVar4 && bVar11) {
        do {
          pPVar8 = pPVar8->ParentClass;
          bVar11 = pPVar8 != (PClass *)0x0;
          if (pPVar8 == pPVar4) break;
        } while (pPVar8 != (PClass *)0x0);
      }
      if (!bVar11) {
        A_Chase(stack,self);
        return 0;
      }
      self->RenderStyle = LegacyRenderStyles[1];
      if ((-1 < *(int *)&self->field_0x49c) && (0x36a < level.maptime - *(int *)&self->field_0x49c))
      {
        local_74.Index = 0;
        local_70.Degrees = 0.0;
        P_DamageMobj(self,(AActor *)0x0,(AActor *)0x0,1000000,&local_74,0,&local_70);
        return 0;
      }
      uVar6 = FRandom::GenRand32(&pr_minotaurchase);
      if ((uVar6 & 0xfe) < 0x1e) {
        local_68.field_1.atag = 1;
        local_68.field_3.Type = '\x03';
        local_50 = 1;
        local_4c = 3;
        local_48.Chars = (char *)0x0;
        local_40 = 8;
        local_3c[0] = 3;
        local_68._0_8_ = self;
        local_58 = self;
        VMFrameStack::Call(stack,&A_MinotaurLook_VMPtr->super_VMFunction,
                           (VMValue *)&local_68.field_1,3,(VMReturn *)0x0,0,(VMException **)0x0);
        lVar10 = -0x30;
        this = &local_48;
        do {
          if (*(char *)((long)&this[1].Chars + 4) == '\x02') {
            FString::~FString(this);
          }
          this = this + -2;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0);
      }
      pAVar3 = (self->target).field_0.p;
      if (pAVar3 != (AActor *)0x0) {
        if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
          if ((0 < ((self->target).field_0.p)->health) &&
             (((((self->target).field_0.p)->flags).Value & 4) != 0)) {
            FaceMovementDirection(self);
            self->reactiontime = 0;
            if ((self->MeleeState == (FState *)0x0) ||
               (bVar11 = AActor::CheckMeleeRange(self), !bVar11)) {
              if ((self->MissileState == (FState *)0x0) ||
                 (bVar11 = P_CheckMissileRange(self), !bVar11)) {
                bVar11 = P_Move(self);
                if (!bVar11) {
                  P_NewChaseDir(self);
                  FaceMovementDirection(self);
                }
                uVar6 = FRandom::GenRand32(&pr_minotaurchase);
                if (5 < (uVar6 & 0xfe)) {
                  return 0;
                }
                AActor::PlayActiveSound(self);
                return 0;
              }
              newstate = self->MissileState;
            }
            else {
              iVar5 = (self->AttackSound).super_FSoundID.ID;
              if (iVar5 != 0) {
                local_78.ID = iVar5;
                S_Sound(self,1,&local_78,1.0,1.0);
              }
              newstate = self->MeleeState;
            }
            AActor::SetState(self,newstate,false);
            return 0;
          }
        }
        else {
          (self->target).field_0.p = (AActor *)0x0;
        }
      }
      AActor::SetIdle(self,false);
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005c74e1:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005c750c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_raven/a_minotaur.cpp"
                ,0x234,"int AF_A_MinotaurChase(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MinotaurChase)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->IsKindOf(RUNTIME_CLASS(AMinotaurFriend)))
	{
		A_Chase (stack, self);
		return 0;
	}

	AMinotaurFriend *self1 = static_cast<AMinotaurFriend *> (self);

	// In case pain caused him to skip his fade in.
	self1->RenderStyle = STYLE_Normal;

	if (self1->StartTime >= 0 && (level.maptime - self1->StartTime) >= MAULATORTICS)
	{
		P_DamageMobj (self1, NULL, NULL, TELEFRAG_DAMAGE, NAME_None);
		return 0;
	}

	if (pr_minotaurchase() < 30)
		CALL_ACTION(A_MinotaurLook, self1);		// adjust to closest target

	if (!self1->target || (self1->target->health <= 0) ||
		!(self1->target->flags&MF_SHOOTABLE))
	{ // look for a new target
		self1->SetIdle();
		return 0;
	}

	FaceMovementDirection (self1);
	self1->reactiontime = 0;

	// Melee attack
	if (self1->MeleeState && self1->CheckMeleeRange ())
	{
		if (self1->AttackSound)
		{
			S_Sound (self1, CHAN_WEAPON, self1->AttackSound, 1, ATTN_NORM);
		}
		self1->SetState (self1->MeleeState);
		return 0;
	}

	// Missile attack
	if (self1->MissileState && P_CheckMissileRange(self1))
	{
		self1->SetState (self1->MissileState);
		return 0;
	}

	// chase towards target
	if (!P_Move (self1))
	{
		P_NewChaseDir (self1);
		FaceMovementDirection (self1);
	}

	// Active sound
	if (pr_minotaurchase() < 6)
	{
		self1->PlayActiveSound ();
	}
	return 0;
}